

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

char * rw::Image::getFilename(char *name)

{
  FILE *__stream;
  size_t *psVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  Error local_4c;
  Error _e;
  int i;
  size_t len;
  char *p;
  char *s;
  void *f;
  ImageGlobals *g;
  char *name_local;
  
  psVar1 = (size_t *)(engine + imageModuleOffset);
  len = *psVar1;
  sVar2 = strlen(name);
  register0x00000000 = sVar2 + 1;
  if ((int)psVar1[1] == 0) {
    name_local = strdup_LOC(name,0x30000,
                            "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 938"
                           );
    makePath(name_local);
    lVar3 = (**(code **)(engine + 0x20))(name_local,"rb");
    if (lVar3 == 0) {
      (*DAT_001685f8)(name_local);
      name_local = (char *)0x0;
    }
    else {
      (**(code **)(engine + 0x28))(lVar3);
      printf("found %s\n",name_local);
    }
  }
  else {
    for (_e.plugin = 0; (int)_e.plugin < (int)psVar1[1]; _e.plugin = _e.plugin + 1) {
      sVar2 = strlen((char *)len);
      pcVar4 = (char *)malloc_LOC(sVar2 + stack0xffffffffffffffc0,0x30018,
                                  "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 950"
                                 );
      if (pcVar4 == (char *)0x0) {
        local_4c.plugin = 0x18;
        local_4c.code = 0x80000002;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp",0x3b8)
        ;
        __stream = _stderr;
        sVar2 = strlen((char *)len);
        pcVar4 = dbgsprint(0x80000002,sVar2 + stack0xffffffffffffffc0);
        fprintf(__stream,"%s\n",pcVar4);
        setError(&local_4c);
        return (char *)0x0;
      }
      strcpy(pcVar4,(char *)len);
      strcat(pcVar4,name);
      makePath(pcVar4);
      lVar3 = (**(code **)(engine + 0x20))(pcVar4,"r");
      if (lVar3 != 0) {
        (**(code **)(engine + 0x28))(lVar3);
        printf("found %s\n",name);
        return pcVar4;
      }
      (*DAT_001685f8)(pcVar4);
      sVar2 = strlen((char *)len);
      len = sVar2 + 1 + len;
    }
    name_local = (char *)0x0;
  }
  return name_local;
}

Assistant:

char*
Image::getFilename(const char *name)
{
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	void *f;
	char *s, *p = g->searchPaths;
	size_t len = strlen(name)+1;
	if(g->numSearchPaths == 0){
		s = rwStrdup(name, MEMDUR_EVENT);
		makePath(s);
		f = engine->filefuncs.rwfopen(s, "rb");
		if(f){
			engine->filefuncs.rwfclose(f);
			printf("found %s\n", s);
			return s;
		}
		rwFree(s);
		return nil;
	}else
		for(int i = 0; i < g->numSearchPaths; i++){
			s = (char*)rwMalloc(strlen(p)+len, MEMDUR_EVENT | ID_IMAGE);
			if(s == nil){
				RWERROR((ERR_ALLOC, strlen(p)+len));
				return nil;
			}
			strcpy(s, p);
			strcat(s, name);
			makePath(s);
			f = engine->filefuncs.rwfopen(s, "r");
			if(f){
				engine->filefuncs.rwfclose(f);
				printf("found %s\n", name);
				return s;
			}
			rwFree(s);
			p += strlen(p) + 1;
		}
	return nil;
}